

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O0

bool TestComparisonsF<Counter<unsigned_char,8u>>(void)

{
  Counter<unsigned_char,_8U> CVar1;
  Counter<unsigned_char,_8U> local_58d;
  Counter<unsigned_char,_8U> local_58c;
  Counter<unsigned_char,_8U> local_58b;
  Counter<unsigned_char,_8U> local_58a;
  Counter<unsigned_char,_8U> local_589;
  Counter<unsigned_char,_8U> local_588;
  Counter<unsigned_char,_8U> local_587;
  Counter<unsigned_char,_8U> local_586;
  Counter<unsigned_char,_8U> local_585;
  Counter<unsigned_char,_8U> local_584;
  Counter<unsigned_char,_8U> local_583;
  Counter<unsigned_char,_8U> local_582;
  Counter<unsigned_char,_8U> local_581;
  Counter<unsigned_char,_8U> local_580;
  Counter<unsigned_char,_8U> local_57f;
  Counter<unsigned_char,_8U> local_57e;
  Counter<unsigned_char,_8U> local_57d;
  Counter<unsigned_char,_8U> local_57c;
  Counter<unsigned_char,_8U> local_57b;
  Counter<unsigned_char,_8U> local_57a;
  Counter<unsigned_char,_8U> local_579;
  Counter<unsigned_char,_8U> local_578;
  Counter<unsigned_char,_8U> local_577;
  Counter<unsigned_char,_8U> local_576;
  Counter<unsigned_char,_8U> local_575;
  Counter<unsigned_char,_8U> local_574;
  Counter<unsigned_char,_8U> local_573;
  Counter<unsigned_char,_8U> local_572;
  Counter<unsigned_char,_8U> local_571;
  uint local_570;
  Counter<unsigned_char,_8U> local_569;
  uint ii_1;
  Counter<unsigned_char,_8U> local_564;
  Counter<unsigned_char,_8U> local_563;
  Counter<unsigned_char,_8U> local_562;
  Counter<unsigned_char,_8U> local_561;
  Counter<unsigned_char,_8U> local_560;
  Counter<unsigned_char,_8U> local_55f;
  Counter<unsigned_char,_8U> local_55e;
  Counter<unsigned_char,_8U> local_55d;
  Counter<unsigned_char,_8U> local_55c;
  Counter<unsigned_char,_8U> local_55b;
  Counter<unsigned_char,_8U> local_55a;
  Counter<unsigned_char,_8U> local_559;
  Counter<unsigned_char,_8U> local_558;
  Counter<unsigned_char,_8U> local_557;
  Counter<unsigned_char,_8U> local_556;
  Counter<unsigned_char,_8U> local_555;
  Counter<unsigned_char,_8U> local_554;
  Counter<unsigned_char,_8U> local_553;
  Counter<unsigned_char,_8U> local_552;
  Counter<unsigned_char,_8U> local_551;
  Counter<unsigned_char,_8U> local_550;
  Counter<unsigned_char,_8U> local_54f;
  Counter<unsigned_char,_8U> local_54e;
  Counter<unsigned_char,_8U> local_54d;
  uint local_54c;
  uint local_548;
  uint ii;
  uint sep;
  Counter<unsigned_char,_8U> local_53c;
  Counter<unsigned_char,_8U> local_53b;
  Counter<unsigned_char,_8U> local_53a;
  bool local_539;
  Counter<unsigned_char,_8U> c;
  Counter<unsigned_char,_8U> b;
  Counter<unsigned_char,_8U> a;
  Counter<unsigned_char,_8U> *pCStack_538;
  uchar d_20;
  uchar d_19;
  uchar d_18;
  uchar d_2;
  uchar d_1;
  uchar d;
  uchar d_26;
  uchar d_25;
  uchar d_24;
  uchar d_23;
  uchar d_22;
  uchar d_21;
  uchar d_8;
  uchar d_7;
  uchar d_6;
  uchar d_5;
  uchar d_4;
  uchar d_3;
  uchar d_29;
  uchar d_28;
  uchar d_27;
  uchar d_11;
  uchar d_10;
  uchar d_9;
  uchar d_35;
  uchar d_34;
  uchar d_33;
  uchar d_32;
  uchar d_31;
  uchar d_30;
  uchar d_17;
  uchar d_16;
  uchar d_15;
  uchar d_14;
  uchar d_13;
  uchar d_12;
  uchar oldValue_1;
  uchar oldValue;
  uchar oldValue_3;
  uchar oldValue_2;
  
  Counter<unsigned_char,_8U>::Counter(&local_53a,'\x02');
  Counter<unsigned_char,_8U>::Counter(&local_53b,'\x02');
  Counter<unsigned_char,_8U>::Counter(&local_53c,'\x03');
  Counter<unsigned_char,_8U>::Counter((Counter<unsigned_char,_8U> *)((long)&sep + 3),&local_53b);
  if (local_53a.Value == sep._3_1_) {
    Counter<unsigned_char,_8U>::Counter((Counter<unsigned_char,_8U> *)((long)&sep + 2),&local_53c);
    if (local_53b.Value == sep._2_1_) {
      local_539 = false;
    }
    else {
      Counter<unsigned_char,_8U>::Counter((Counter<unsigned_char,_8U> *)((long)&sep + 1),&local_53c)
      ;
      Counter<unsigned_char,_8U>::operator=(&local_53b,(ThisType *)((long)&sep + 1));
      Counter<unsigned_char,_8U>::Counter((Counter<unsigned_char,_8U> *)&sep,&local_53c);
      if (local_53b.Value == (uchar)sep) {
        Counter<unsigned_char,_8U>::Counter
                  ((Counter<unsigned_char,_8U> *)((long)&ii + 3),&local_53b);
        if (local_53a.Value == ii._3_1_) {
          local_539 = false;
        }
        else {
          for (local_548 = 0; local_548 < 3; local_548 = local_548 + 1) {
            Counter<unsigned_char,_8U>::operator=(&local_53a,0xff - (char)local_548);
            Counter<unsigned_char,_8U>::operator=(&local_53b,'\0');
            Counter<unsigned_char,_8U>::operator=(&local_53c,(char)local_548 + '\x01');
            for (local_54c = 0; local_54c < 1000; local_54c = local_54c + 1) {
              Counter<unsigned_char,_8U>::Counter(&local_54d,&local_53a);
              if (local_53a.Value != local_54d.Value) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_54e,&local_53b);
              if (local_53b.Value != local_54e.Value) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_54f,&local_53c);
              if (local_53c.Value != local_54f.Value) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_550,&local_53b);
              if (local_53a.Value == local_550.Value) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_551,&local_53c);
              if (local_53a.Value == local_551.Value) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_552,&local_53a);
              if (local_53b.Value == local_552.Value) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_553,&local_53c);
              if (local_53b.Value == local_553.Value) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_554,&local_53a);
              if (local_53c.Value == local_554.Value) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_555,&local_53b);
              if (local_53c.Value == local_555.Value) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_556,&local_53b);
              if ((byte)(local_53a.Value - local_556.Value) < 0x80) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_557,&local_53c);
              if ((byte)(local_53a.Value - local_557.Value) < 0x80) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_558,&local_53c);
              if ((byte)(local_53b.Value - local_558.Value) < 0x80) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_559,&local_53b);
              if (0x7f < (byte)(local_559.Value - local_53a.Value)) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_55a,&local_53c);
              if (0x7f < (byte)(local_55a.Value - local_53a.Value)) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_55b,&local_53c);
              if (0x7f < (byte)(local_55b.Value - local_53b.Value)) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_55c,&local_53a);
              if (0x7f < (byte)(local_55c.Value - local_53a.Value)) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_55d,&local_53b);
              if (0x7f < (byte)(local_55d.Value - local_53b.Value)) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_55e,&local_53c);
              if (0x7f < (byte)(local_55e.Value - local_53c.Value)) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_55f,&local_53a);
              if ((byte)(local_55f.Value - local_53b.Value) < 0x80) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_560,&local_53a);
              if ((byte)(local_560.Value - local_53c.Value) < 0x80) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_561,&local_53b);
              if ((byte)(local_561.Value - local_53c.Value) < 0x80) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_562,&local_53a);
              if (0x7f < (byte)(local_53b.Value - local_562.Value)) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_563,&local_53a);
              if (0x7f < (byte)(local_53c.Value - local_563.Value)) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_564,&local_53b);
              if (0x7f < (byte)(local_53c.Value - local_564.Value)) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter
                        ((Counter<unsigned_char,_8U> *)((long)&ii_1 + 3),&local_53a);
              if (0x7f < (byte)(local_53a.Value - ii_1._3_1_)) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter
                        ((Counter<unsigned_char,_8U> *)((long)&ii_1 + 2),&local_53b);
              if (0x7f < (byte)(local_53b.Value - ii_1._2_1_)) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter
                        ((Counter<unsigned_char,_8U> *)((long)&ii_1 + 1),&local_53c);
              CVar1.Value = local_53a.Value;
              if (0x7f < (byte)(local_53c.Value - ii_1._1_1_)) {
                return false;
              }
              local_53a.Value = local_53a.Value + '\x01';
              Counter<unsigned_char,_8U>::Counter((Counter<unsigned_char,_8U> *)&ii_1,CVar1.Value);
              CVar1.Value = local_53c.Value;
              local_53b.Value = local_53b.Value + '\x01';
              local_53c.Value = local_53c.Value + '\x01';
              Counter<unsigned_char,_8U>::Counter(&local_569,CVar1.Value);
            }
            for (local_570 = 0; local_570 < 2000; local_570 = local_570 + 1) {
              Counter<unsigned_char,_8U>::Counter(&local_571,&local_53a);
              if (local_53a.Value != local_571.Value) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_572,&local_53b);
              if (local_53b.Value != local_572.Value) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_573,&local_53c);
              pCStack_538 = &local_573;
              if (local_53c.Value != local_573.Value) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_574,&local_53b);
              if (local_53a.Value == local_574.Value) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_575,&local_53c);
              if (local_53a.Value == local_575.Value) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_576,&local_53a);
              if (local_53b.Value == local_576.Value) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_577,&local_53c);
              if (local_53b.Value == local_577.Value) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_578,&local_53a);
              if (local_53c.Value == local_578.Value) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_579,&local_53b);
              if (local_53c.Value == local_579.Value) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_57a,&local_53b);
              if ((byte)(local_53a.Value - local_57a.Value) < 0x80) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_57b,&local_53c);
              if ((byte)(local_53a.Value - local_57b.Value) < 0x80) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_57c,&local_53c);
              if ((byte)(local_53b.Value - local_57c.Value) < 0x80) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_57d,&local_53b);
              if (0x7f < (byte)(local_57d.Value - local_53a.Value)) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_57e,&local_53c);
              if (0x7f < (byte)(local_57e.Value - local_53a.Value)) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_57f,&local_53c);
              if (0x7f < (byte)(local_57f.Value - local_53b.Value)) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_580,&local_53a);
              if (0x7f < (byte)(local_580.Value - local_53a.Value)) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_581,&local_53b);
              if (0x7f < (byte)(local_581.Value - local_53b.Value)) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_582,&local_53c);
              if (0x7f < (byte)(local_582.Value - local_53c.Value)) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_583,&local_53a);
              if ((byte)(local_583.Value - local_53b.Value) < 0x80) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_584,&local_53a);
              if ((byte)(local_584.Value - local_53c.Value) < 0x80) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_585,&local_53b);
              if ((byte)(local_585.Value - local_53c.Value) < 0x80) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_586,&local_53a);
              if (0x7f < (byte)(local_53b.Value - local_586.Value)) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_587,&local_53a);
              if (0x7f < (byte)(local_53c.Value - local_587.Value)) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_588,&local_53b);
              if (0x7f < (byte)(local_53c.Value - local_588.Value)) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_589,&local_53a);
              if (0x7f < (byte)(local_53a.Value - local_589.Value)) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_58a,&local_53b);
              if (0x7f < (byte)(local_53b.Value - local_58a.Value)) {
                return false;
              }
              Counter<unsigned_char,_8U>::Counter(&local_58b,&local_53c);
              CVar1.Value = local_53a.Value;
              if (0x7f < (byte)(local_53c.Value - local_58b.Value)) {
                return false;
              }
              local_53a.Value = local_53a.Value + 0xff;
              Counter<unsigned_char,_8U>::Counter(&local_58c,CVar1.Value);
              CVar1.Value = local_53c.Value;
              local_53b.Value = local_53b.Value + 0xff;
              local_53c.Value = local_53c.Value + 0xff;
              Counter<unsigned_char,_8U>::Counter(&local_58d,CVar1.Value);
            }
          }
          local_539 = true;
        }
      }
      else {
        local_539 = false;
      }
    }
  }
  else {
    local_539 = false;
  }
  return local_539;
}

Assistant:

bool TestComparisonsF()
{
    CounterT a = 2, b = 2, c = 3;
    TEST_CHECK(a == b);
    TEST_CHECK(b != c);
    b = c;
    TEST_CHECK(b == c);
    TEST_CHECK(a != b);

    for (unsigned sep = 0; sep < 3; ++sep)
    {
        a = CounterT::kMask - sep;
        b = 0;
        c = 1 + sep;

        for (unsigned ii = 0; ii < 1000; ++ii)
        {
            TEST_CHECK(a == a);
            TEST_CHECK(b == b);
            TEST_CHECK(c == c);
            TEST_CHECK(a != b);
            TEST_CHECK(a != c);
            TEST_CHECK(b != a);
            TEST_CHECK(b != c);
            TEST_CHECK(c != a);
            TEST_CHECK(c != b);

            TEST_CHECK(a < b);
            TEST_CHECK(a < c);
            TEST_CHECK(b < c);
            TEST_CHECK(a <= b);
            TEST_CHECK(a <= c);
            TEST_CHECK(b <= c);
            TEST_CHECK(a <= a);
            TEST_CHECK(b <= b);
            TEST_CHECK(c <= c);

            TEST_CHECK(b > a);
            TEST_CHECK(c > a);
            TEST_CHECK(c > b);
            TEST_CHECK(b >= a);
            TEST_CHECK(c >= a);
            TEST_CHECK(c >= b);
            TEST_CHECK(a >= a);
            TEST_CHECK(b >= b);
            TEST_CHECK(c >= c);

            a++;
            ++b;
            c++;
        }

        for (unsigned ii = 0; ii < 2000; ++ii)
        {
            TEST_CHECK(a == a);
            TEST_CHECK(b == b);
            TEST_CHECK(c == c);
            TEST_CHECK(a != b);
            TEST_CHECK(a != c);
            TEST_CHECK(b != a);
            TEST_CHECK(b != c);
            TEST_CHECK(c != a);
            TEST_CHECK(c != b);

            TEST_CHECK(a < b);
            TEST_CHECK(a < c);
            TEST_CHECK(b < c);
            TEST_CHECK(a <= b);
            TEST_CHECK(a <= c);
            TEST_CHECK(b <= c);
            TEST_CHECK(a <= a);
            TEST_CHECK(b <= b);
            TEST_CHECK(c <= c);

            TEST_CHECK(b > a);
            TEST_CHECK(c > a);
            TEST_CHECK(c > b);
            TEST_CHECK(b >= a);
            TEST_CHECK(c >= a);
            TEST_CHECK(c >= b);
            TEST_CHECK(a >= a);
            TEST_CHECK(b >= b);
            TEST_CHECK(c >= c);

            a--;
            --b;
            c--;
        }
    }

    return true;
}